

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::get_object_handle(void *ptr,type_info *type)

{
  bool bVar1;
  internals *piVar2;
  pointer ppVar3;
  type_info *ptVar4;
  type_info *instance_type;
  _Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> it;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>_>
  range;
  unordered_multimap<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
  *instances;
  type_info *type_local;
  void *ptr_local;
  
  type_local = (type_info *)ptr;
  piVar2 = get_internals();
  range.second.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>)
       &piVar2->registered_instances;
  _it = std::
        unordered_multimap<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
        ::equal_range((unordered_multimap<const_void_*,_void_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>_>
                       *)range.second.
                         super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>.
                         _M_cur,&type_local);
  instance_type =
       (type_info *)it.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur
  ;
  while( true ) {
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> *)
                       &instance_type,
                       (_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> *)&range);
    if (!bVar1) {
      memset(&ptr_local,0,8);
      handle::handle((handle *)&ptr_local);
      return (handle)(PyObject *)ptr_local;
    }
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> *)
                        &instance_type);
    ptVar4 = get_type_info(*(PyTypeObject **)((long)ppVar3->second + 8));
    if ((ptVar4 != (type_info *)0x0) && (ptVar4 == type)) break;
    std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> *)&instance_type)
    ;
  }
  ppVar3 = std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>::
           operator->((_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false> *)
                      &instance_type);
  handle::handle((handle *)&ptr_local,(PyObject *)ppVar3->second);
  return (handle)(PyObject *)ptr_local;
}

Assistant:

PYBIND11_NOINLINE inline handle get_object_handle(const void *ptr, const detail::type_info *type ) {
    auto &instances = get_internals().registered_instances;
    auto range = instances.equal_range(ptr);
    for (auto it = range.first; it != range.second; ++it) {
        auto instance_type = detail::get_type_info(Py_TYPE(it->second));
        if (instance_type && instance_type == type)
            return handle((PyObject *) it->second);
    }
    return handle();
}